

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_streamable_read_header(archive_read *a,archive_entry *entry)

{
  long lVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *pcVar4;
  archive *in_RDI;
  ssize_t bytes;
  char *end;
  char *p;
  int64_t skipped;
  zip *zip;
  zip *in_stack_000000b8;
  archive_entry *in_stack_000000c0;
  archive_read *in_stack_000000c8;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  char *local_30;
  
  in_RDI->archive_format = 0x50000;
  if (in_RDI->archive_format_name == (char *)0x0) {
    in_RDI->archive_format_name = "ZIP";
  }
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(int *)(lVar1 + 0x58) == -1) {
    *(undefined4 *)(lVar1 + 0x58) = 0;
  }
  if (*(long *)(lVar1 + 0x60) == 0) {
    pvVar3 = malloc(0x88);
    *(void **)(lVar1 + 0x60) = pvVar3;
    if (*(long *)(lVar1 + 0x60) == 0) {
      archive_set_error(in_RDI,0xc,"Out  of memory");
      return L'\xffffffe2';
    }
  }
  *(undefined8 *)(lVar1 + 0x90) = *(undefined8 *)(lVar1 + 0x60);
  memset(*(void **)(lVar1 + 0x90),0,0x88);
  __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined8 *)(lVar1 + 0x88) = 0;
  do {
    local_30 = (char *)__archive_read_ahead
                                 (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                  (ssize_t *)0x158ca6);
    if (local_30 == (char *)0x0) {
      return L'\xffffffe2';
    }
    pcVar4 = local_30 + (long)in_stack_ffffffffffffffc0;
    for (; local_30 + 4 <= pcVar4; local_30 = local_30 + 1) {
      if ((*local_30 == 'P') && (local_30[1] == 'K')) {
        if ((local_30[2] == '\x03') && (local_30[3] == '\x04')) {
          __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          wVar2 = zip_read_local_file_header(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
          return wVar2;
        }
        if ((local_30[2] == '\x01') && (local_30[3] == '\x02')) {
          return L'\x01';
        }
        if (((local_30[2] == '\x05') && (local_30[3] == '\x06')) ||
           ((local_30[2] == '\x06' && (local_30[3] == '\x06')))) {
          return L'\x01';
        }
      }
    }
    __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  } while( true );
}

Assistant:

static int
archive_read_format_zip_streamable_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct zip *zip;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	zip = (struct zip *)(a->format->data);

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	/* Make sure we have a zip_entry structure to use. */
	if (zip->zip_entries == NULL) {
		zip->zip_entries = malloc(sizeof(struct zip_entry));
		if (zip->zip_entries == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Out  of memory");
			return ARCHIVE_FATAL;
		}
	}
	zip->entry = zip->zip_entries;
	memset(zip->entry, 0, sizeof(struct zip_entry));

	/* Search ahead for the next local file header. */
	__archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	for (;;) {
		int64_t skipped = 0;
		const char *p, *end;
		ssize_t bytes;

		p = __archive_read_ahead(a, 4, &bytes);
		if (p == NULL)
			return (ARCHIVE_FATAL);
		end = p + bytes;

		while (p + 4 <= end) {
			if (p[0] == 'P' && p[1] == 'K') {
				if (p[2] == '\003' && p[3] == '\004') {
					/* Regular file entry. */
					__archive_read_consume(a, skipped);
					return zip_read_local_file_header(a,
					    entry, zip);
				}

                              /*
                               * TODO: We cannot restore permissions
                               * based only on the local file headers.
                               * Consider scanning the central
                               * directory and returning additional
                               * entries for at least directories.
                               * This would allow us to properly set
                               * directory permissions.
			       *
			       * This won't help us fix symlinks
			       * and may not help with regular file
			       * permissions, either.  <sigh>
                               */
                              if (p[2] == '\001' && p[3] == '\002') {
                                      return (ARCHIVE_EOF);
                              }

                              /* End of central directory?  Must be an
                               * empty archive. */
                              if ((p[2] == '\005' && p[3] == '\006')
                                  || (p[2] == '\006' && p[3] == '\006'))
                                      return (ARCHIVE_EOF);
			}
			++p;
			++skipped;
		}
		__archive_read_consume(a, skipped);
	}
}